

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsUtils.cpp
# Opt level: O1

void * Js::UnboxAsmJsArguments(ScriptFunction *func,Var *origArgs,char *argDst,CallInfo callInfo)

{
  char *pcVar1;
  Which WVar2;
  Type p_Var3;
  code *pcVar4;
  Type TVar5;
  PropertyRecord *this;
  bool bVar6;
  AsmJsVarType AVar7;
  int32 iVar8;
  uint uVar9;
  ProxyEntryPointInfo *pPVar10;
  undefined4 *puVar11;
  FunctionBody *this_00;
  AsmJsFunctionInfo *this_01;
  ulong uVar12;
  int64 iVar13;
  CallInfo CVar14;
  RecyclableObject *instance;
  size_t sVar15;
  undefined1 *aValue;
  Var pvVar16;
  undefined4 extraout_var;
  ScriptContext *pSVar17;
  undefined1 *puVar18;
  char *pcVar19;
  ulong uVar20;
  float fVar21;
  double dVar22;
  undefined1 local_c0 [8];
  ArgumentReader reader;
  CallInfo callInfo_local;
  PropertyRecord *local_88;
  PropertyRecord *highPropRecord;
  undefined1 *local_78;
  Type local_70;
  char *local_68;
  uint local_5c;
  AsmJsFunctionInfo *local_58;
  PropertyRecord *local_50;
  PropertyRecord *lowPropRecord;
  undefined4 *local_40;
  char local_31;
  
  reader.super_Arguments.Values = (Type)callInfo;
  local_68 = argDst;
  pPVar10 = ScriptFunction::GetEntryPointInfo(func);
  p_Var3 = pPVar10->jsMethod;
  local_70 = (Type)origArgs;
  if (p_Var3 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                ,0xb8,"(address)","address");
    if (!bVar6) {
LAB_0096a1af:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  TVar5 = local_70;
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  this_01 = (AsmJsFunctionInfo *)
            FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,AsmJsFunctionInfo);
  lowPropRecord =
       (PropertyRecord *)
       (((((func->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_31 = DAT_015aa2dc;
  local_c0 = (undefined1  [8])reader.super_Arguments.Values;
  reader.super_Arguments.Info = TVar5;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_c0,(CallInfo *)&reader.super_Arguments.Values);
  pcVar19 = local_68;
  uVar12 = (ulong)this_01->mArgCount;
  if (this_01->mArgCount == 0) {
LAB_0096a118:
    AsmJsModuleInfo::EnsureHeapAttached(func);
    return p_Var3;
  }
  local_5c = (local_c0._0_4_ & 0xffffff) - 1;
  local_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  callInfo_local = (CallInfo)NAN;
  highPropRecord._4_4_ = NAN;
  uVar20 = 0;
  local_58 = this_01;
LAB_00969617:
  puVar11 = local_40;
  if ((short)uVar12 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                "mArgCount != Constants::InvalidArgSlot");
    if (!bVar6) goto LAB_0096a1af;
    *puVar11 = 0;
  }
  if (this_01->mArgCount <= uVar20) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar11 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                ,0x3b9,"(index < mArgCount)","index < mArgCount");
    if (!bVar6) goto LAB_0096a1af;
    *puVar11 = 0;
  }
  WVar2 = (this_01->mArgType).ptr[uVar20];
  pSVar17 = (ScriptContext *)(ulong)WVar2;
  AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
  TVar5 = local_70;
  uVar9 = (uint)uVar20;
  if (local_50._0_1_ == Int) {
    pvVar16 = (Var)0x0;
    if (uVar9 < local_5c) {
      if (local_31 != '\0') {
        bVar6 = VarIs<Js::JavascriptString>(*(Var *)((long)local_70 + uVar20 * 8));
        if (bVar6) {
          pvVar16 = (Var)ConvertStringToInt64(*(Var *)((long)TVar5 + uVar20 * 8),pSVar17);
          goto LAB_00969c9e;
        }
      }
      pvVar16 = *(Var *)((long)TVar5 + uVar20 * 8);
      if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = local_40;
        *local_40 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar6) goto LAB_0096a1af;
        *puVar11 = 0;
        this_01 = local_58;
      }
      pcVar19 = local_68;
      if (((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
        if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = local_40;
          *local_40 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar6) goto LAB_0096a1af;
          *puVar11 = 0;
          this_01 = local_58;
        }
      }
      else {
        uVar9 = JavascriptMath::ToInt32_Full(pvVar16,(ScriptContext *)lowPropRecord);
        pvVar16 = (Var)(ulong)uVar9;
        pcVar19 = local_68;
      }
    }
LAB_00969c9e:
    pcVar1 = pcVar19 + uVar20 * 8 + 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(int *)(pcVar19 + uVar20 * 8 + 8) = (int)pvVar16;
  }
  else {
    if (this_01->mArgCount == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                  ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                  "mArgCount != Constants::InvalidArgSlot");
      if (!bVar6) goto LAB_0096a1af;
      *puVar11 = 0;
    }
    if (this_01->mArgCount <= uVar20) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar11 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                  ,0x3b9,"(index < mArgCount)","index < mArgCount");
      if (!bVar6) goto LAB_0096a1af;
      *puVar11 = 0;
    }
    WVar2 = (this_01->mArgType).ptr[uVar20];
    pSVar17 = (ScriptContext *)(ulong)WVar2;
    AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
    TVar5 = local_70;
    if (local_50._0_1_ == Int64) {
      if (local_31 == '\0') {
LAB_0096a19f:
        JavascriptError::ThrowTypeError((ScriptContext *)lowPropRecord,-0x7ff5e49f,(PCWSTR)0x0);
      }
      if (uVar9 < local_5c) {
        bVar6 = VarIs<Js::JavascriptString>(*(Var *)((long)local_70 + uVar20 * 8));
        pvVar16 = *(Var *)((long)TVar5 + uVar20 * 8);
        if (bVar6) {
          uVar12 = ConvertStringToInt64(pvVar16,pSVar17);
        }
        else {
          bVar6 = DynamicObject::IsBaseDynamicObject(pvVar16);
          pvVar16 = *(Var *)((long)TVar5 + uVar20 * 8);
          if (bVar6) {
            instance = VarTo<Js::RecyclableObject>(pvVar16);
            local_50 = (PropertyRecord *)0x0;
            local_88 = (PropertyRecord *)0x0;
            sVar15 = PAL_wcslen(L"low");
            this = lowPropRecord;
            ScriptContext::GetOrAddPropertyRecord
                      ((ScriptContext *)lowPropRecord,L"low",(int)sVar15,&local_50);
            sVar15 = PAL_wcslen(L"high");
            ScriptContext::GetOrAddPropertyRecord
                      ((ScriptContext *)this,L"high",(int)sVar15,&local_88);
            aValue = (undefined1 *)
                     JavascriptOperators::OP_GetProperty
                               (instance,local_50->pid,(ScriptContext *)this);
            pvVar16 = JavascriptOperators::OP_GetProperty
                                (instance,local_88->pid,(ScriptContext *)this);
            puVar18 = (undefined1 *)((ulong)aValue & 0x1ffff00000000);
            if (puVar18 != &DAT_1000000000000 &&
                ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
              AssertCount = AssertCount + 1;
              local_78 = puVar18;
              Throw::LogAssert();
              puVar11 = local_40;
              *local_40 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_0096a1af;
              *puVar11 = 0;
              puVar18 = local_78;
              this_01 = local_58;
            }
            if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
              local_78 = aValue;
              if (puVar18 != &DAT_1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar11 = local_40;
                *local_40 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_0096a1af;
                *puVar11 = 0;
              }
            }
            else {
              iVar8 = JavascriptMath::ToInt32_Full(aValue,(ScriptContext *)lowPropRecord);
              local_78 = (undefined1 *)CONCAT44(extraout_var,iVar8);
            }
            if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
                ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar11 = local_40;
              *local_40 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_0096a1af;
              *puVar11 = 0;
              this_01 = local_58;
            }
            pcVar19 = local_68;
            if (((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
              if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar11 = local_40;
                *local_40 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_0096a1af;
                *puVar11 = 0;
                this_01 = local_58;
              }
            }
            else {
              uVar9 = JavascriptMath::ToInt32_Full(pvVar16,(ScriptContext *)lowPropRecord);
              pvVar16 = (Var)(ulong)uVar9;
              pcVar19 = local_68;
            }
            uVar12 = (long)pvVar16 << 0x20 | (ulong)local_78 & 0xffffffff;
          }
          else {
            if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
                ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar11 = local_40;
              *local_40 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                          ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                          "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
              if (!bVar6) goto LAB_0096a1af;
              *puVar11 = 0;
              this_01 = local_58;
            }
            pcVar19 = local_68;
            if (((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
              if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar11 = local_40;
                *local_40 = 1;
                bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                            ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                            "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
                if (!bVar6) goto LAB_0096a1af;
                *puVar11 = 0;
                this_01 = local_58;
              }
            }
            else {
              uVar9 = JavascriptMath::ToInt32_Full(pvVar16,(ScriptContext *)lowPropRecord);
              pvVar16 = (Var)(ulong)uVar9;
              pcVar19 = local_68;
            }
            uVar12 = (ulong)(int)pvVar16;
          }
        }
      }
      else {
        uVar12 = 0;
      }
      *(ulong *)(pcVar19 + uVar20 * 8 + 8) = uVar12;
    }
    else {
      if (this_01->mArgCount == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                    "mArgCount != Constants::InvalidArgSlot");
        if (!bVar6) goto LAB_0096a1af;
        *puVar11 = 0;
      }
      if (this_01->mArgCount <= uVar20) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                    ,0x3b9,"(index < mArgCount)","index < mArgCount");
        if (!bVar6) goto LAB_0096a1af;
        *puVar11 = 0;
      }
      WVar2 = (this_01->mArgType).ptr[uVar20];
      pSVar17 = (ScriptContext *)(ulong)WVar2;
      AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
      TVar5 = local_70;
      if (local_50._0_1_ == Float) {
        fVar21 = highPropRecord._4_4_;
        if (uVar9 < local_5c) {
          if (local_31 != '\0') {
            bVar6 = VarIs<Js::JavascriptString>(*(Var *)((long)local_70 + uVar20 * 8));
            if (bVar6) {
              iVar13 = ConvertStringToInt64(*(Var *)((long)TVar5 + uVar20 * 8),pSVar17);
              fVar21 = (float)iVar13;
              goto LAB_0096a0e2;
            }
          }
          pvVar16 = *(Var *)((long)TVar5 + uVar20 * 8);
          if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = local_40;
            *local_40 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar6) goto LAB_0096a1af;
            *puVar11 = 0;
            this_01 = local_58;
          }
          if (((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
            dVar22 = (double)(int)pvVar16;
          }
          else if (pvVar16 < (Var)0x4000000000000) {
            dVar22 = JavascriptConversion::ToNumber_Full(pvVar16,(ScriptContext *)lowPropRecord);
          }
          else {
            dVar22 = (double)((ulong)pvVar16 ^ 0xfffc000000000000);
          }
          fVar21 = (float)dVar22;
        }
LAB_0096a0e2:
        pcVar1 = pcVar19 + uVar20 * 8 + 8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(float *)(pcVar19 + uVar20 * 8 + 8) = fVar21;
      }
      else {
        if (this_01->mArgCount == 0xffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b8,"(mArgCount != Constants::InvalidArgSlot)",
                                      "mArgCount != Constants::InvalidArgSlot");
          if (!bVar6) goto LAB_0096a1af;
          *puVar11 = 0;
        }
        if (this_01->mArgCount <= uVar20) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                      ,0x3b9,"(index < mArgCount)","index < mArgCount");
          if (!bVar6) goto LAB_0096a1af;
          *puVar11 = 0;
        }
        WVar2 = (this_01->mArgType).ptr[uVar20];
        pSVar17 = (ScriptContext *)(ulong)WVar2;
        AsmJsVarType::AsmJsVarType((AsmJsVarType *)&local_50,WVar2);
        TVar5 = local_70;
        if (local_50._0_1_ != Double) {
          AVar7 = AsmJsFunctionInfo::GetArgType(this_01,(ArgSlot)uVar20);
          if (10 < (byte)(AVar7.which_ - Int32x4)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar11 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsUtils.cpp"
                                        ,0x143,"((0))","UNREACHED");
            if (bVar6) {
              *puVar11 = 0;
              goto LAB_0096a19f;
            }
            goto LAB_0096a1af;
          }
          goto LAB_0096a19f;
        }
        CVar14 = callInfo_local;
        if (uVar9 < local_5c) {
          if (local_31 != '\0') {
            bVar6 = VarIs<Js::JavascriptString>(*(Var *)((long)local_70 + uVar20 * 8));
            if (bVar6) {
              CVar14 = (CallInfo)ConvertStringToInt64(*(Var *)((long)TVar5 + uVar20 * 8),pSVar17);
              goto LAB_0096a100;
            }
          }
          pvVar16 = *(Var *)((long)TVar5 + uVar20 * 8);
          if (((ulong)pvVar16 & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = local_40;
            *local_40 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar6) goto LAB_0096a1af;
            *puVar11 = 0;
            this_01 = local_58;
          }
          if (((ulong)pvVar16 & 0xffff000000000000) == 0x1000000000000) {
            CVar14 = (CallInfo)(double)(int)pvVar16;
          }
          else if (pvVar16 < (Var)0x4000000000000) {
            CVar14 = (CallInfo)
                     JavascriptConversion::ToNumber_Full(pvVar16,(ScriptContext *)lowPropRecord);
          }
          else {
            CVar14 = (CallInfo)((ulong)pvVar16 ^ 0xfffc000000000000);
          }
        }
LAB_0096a100:
        *(CallInfo *)(pcVar19 + uVar20 * 8 + 8) = CVar14;
      }
    }
  }
  uVar20 = uVar20 + 1;
  uVar12 = (ulong)this_01->mArgCount;
  if (uVar12 <= uVar20) goto LAB_0096a118;
  goto LAB_00969617;
}

Assistant:

void * UnboxAsmJsArguments(ScriptFunction* func, Var * origArgs, char * argDst, CallInfo callInfo)
    {
        void * address = reinterpret_cast<void*>(func->GetEntryPointInfo()->jsMethod);
        Assert(address);
        AsmJsFunctionInfo* info = func->GetFunctionBody()->GetAsmJsFunctionInfo();
        ScriptContext* scriptContext = func->GetScriptContext();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        bool allowTestInputs = CONFIG_FLAG(WasmI64);
#endif
        ArgumentReader reader(&callInfo, origArgs);
        uint actualArgCount = reader.Info.Count - 1; // -1 for ScriptFunction
        argDst = argDst + MachPtr; // add one first so as to skip the ScriptFunction argument
        for (ArgSlot i = 0; i < info->GetArgCount(); i++)
        {

            if (info->GetArgType(i).isInt())
            {
                int32 intVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        intVal = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else
#endif
                        intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                }
                else
                {
                    intVal = 0;
                }

#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(int32*)argDst = intVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isInt64())
            {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                if (!allowTestInputs)
#endif
                {
                    JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
                }

#if ENABLE_DEBUG_CONFIG_OPTIONS
                int64 val;
                if (i < actualArgCount)
                {
                    if (VarIs<JavascriptString>(*origArgs))
                    {
                        val = ConvertStringToInt64(*origArgs, scriptContext);
                    }
                    else if (DynamicObject::IsBaseDynamicObject(*origArgs))
                    {
                        RecyclableObject* object = VarTo<RecyclableObject>(*origArgs);
                        PropertyRecord const * lowPropRecord = nullptr;
                        PropertyRecord const * highPropRecord = nullptr;
                        scriptContext->GetOrAddPropertyRecord(_u("low"), (int)wcslen(_u("low")), &lowPropRecord);
                        scriptContext->GetOrAddPropertyRecord(_u("high"), (int)wcslen(_u("high")), &highPropRecord);
                        Var low = JavascriptOperators::OP_GetProperty(object, lowPropRecord->GetPropertyId(), scriptContext);
                        Var high = JavascriptOperators::OP_GetProperty(object, highPropRecord->GetPropertyId(), scriptContext);

                        uint64 lowVal = JavascriptMath::ToInt32(low, scriptContext);
                        uint64 highVal = JavascriptMath::ToInt32(high, scriptContext);
                        val = (highVal << 32) | (lowVal & 0xFFFFFFFF);
                    }
                    else
                    {
                        int32 intVal = JavascriptMath::ToInt32(*origArgs, scriptContext);
                        val = (int64)intVal;
                    }
                }
                else
                {
                    val = 0;
                }

                *(int64*)(argDst) = val;
                argDst += sizeof(int64);
#endif
            }
            else if (info->GetArgType(i).isFloat())
            {
                float floatVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int32 val = (int32)ConvertStringToInt64(*origArgs, scriptContext);
                        floatVal = *(float*)&val;
                    }
                    else
#endif
                        floatVal = (float)(JavascriptConversion::ToNumber(*origArgs, scriptContext));
                }
                else
                {
                    floatVal = (float)(JavascriptNumber::NaN);
                }
#if TARGET_64
                *(int64*)(argDst) = 0;
#endif
                *(float*)argDst = floatVal;
                argDst = argDst + MachPtr;
            }
            else if (info->GetArgType(i).isDouble())
            {
                double doubleVal;
                if (i < actualArgCount)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    if (allowTestInputs && VarIs<JavascriptString>(*origArgs))
                    {
                        int64 val = ConvertStringToInt64(*origArgs, scriptContext);
                        doubleVal = *(double*)&val;
                    }
                    else
#endif
                        doubleVal = JavascriptConversion::ToNumber(*origArgs, scriptContext);
                }
                else
                {
                    doubleVal = JavascriptNumber::NaN;
                }

                *(double*)argDst = doubleVal;
                argDst = argDst + sizeof(double);
            }
            else if (info->GetArgType(i).isSIMD())
            {
                // Todo:: support test input for wasm.simd
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            else
            {
                Assert(UNREACHED);
                JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidTypeConversion);
            }
            ++origArgs;
        }

        AsmJsModuleInfo::EnsureHeapAttached(func);

        // for convenience, lets take the opportunity to return the asm.js entrypoint address
        return address;
    }